

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::populatePreceding(BreakCache *this,UErrorCode *status)

{
  UVector32 *this_00;
  RuleBasedBreakIterator *pRVar1;
  int32_t *piVar2;
  UErrorCode *pUVar3;
  UBool UVar4;
  uint16_t uVar5;
  int32_t iVar6;
  uint uVar7;
  int64_t iVar8;
  ulong uVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t positionStatusIdx;
  int32_t position;
  int32_t local_40;
  int32_t local_3c;
  UErrorCode *local_38;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  iVar11 = this->fBoundaries[this->fStartBufIdx];
  if (iVar11 == 0) {
    return '\0';
  }
  local_3c = 0;
  local_40 = 0;
  UVar4 = DictionaryCache::preceding(this->fBI->fDictionaryCache,iVar11,&local_3c,&local_40);
  iVar16 = iVar11;
  local_38 = status;
  if (UVar4 != '\0') {
    uVar10 = this->fStartBufIdx - 1U & 0x7f;
    if (uVar10 == this->fEndBufIdx) {
      this->fEndBufIdx = this->fStartBufIdx + 0x7eU & 0x7f;
    }
    this->fBoundaries[uVar10] = local_3c;
    this->fStatuses[uVar10] = (uint16_t)local_40;
    this->fStartBufIdx = uVar10;
    this->fBufIdx = uVar10;
    this->fTextIdx = local_3c;
    return '\x01';
  }
  do {
    iVar6 = 0;
    if (iVar16 < 0x1f) {
      iVar16 = 0;
LAB_0029c985:
      iVar15 = 0;
    }
    else {
      iVar16 = handleSafePrevious(this->fBI,iVar16 + -0x1e);
      if (iVar16 + 1U < 2) goto LAB_0029c985;
      pRVar1 = this->fBI;
      pRVar1->fPosition = iVar16;
      iVar6 = handleNext(pRVar1);
      if (iVar6 <= iVar16 + 4) {
        utext_setNativeIndex_63(&this->fBI->fText,(long)iVar6);
        iVar8 = utext_getPreviousNativeIndex_63(&this->fBI->fText);
        if (iVar8 == iVar16) {
          iVar6 = handleNext(this->fBI);
        }
      }
      iVar15 = this->fBI->fRuleStatusIndex;
    }
  } while (iVar11 <= iVar6);
  this_00 = &this->fSideBuffer;
  local_40 = iVar15;
  UVector32::removeAllElements(this_00);
  iVar12 = (this->fSideBuffer).count;
  if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
    UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,local_38);
    iVar12 = (this->fSideBuffer).count;
    if (UVar4 != '\0') goto LAB_0029ca29;
  }
  else {
LAB_0029ca29:
    (this->fSideBuffer).elements[iVar12] = iVar6;
    iVar12 = (this->fSideBuffer).count + 1;
    (this->fSideBuffer).count = iVar12;
  }
  if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
    UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,local_38);
    if (UVar4 != '\0') {
      iVar12 = (this->fSideBuffer).count;
      goto LAB_0029ca6b;
    }
  }
  else {
LAB_0029ca6b:
    (this->fSideBuffer).elements[iVar12] = iVar15;
    piVar2 = &(this->fSideBuffer).count;
    *piVar2 = *piVar2 + 1;
  }
  do {
    iVar16 = local_40;
    pRVar1 = this->fBI;
    pRVar1->fPosition = iVar6;
    local_3c = handleNext(pRVar1);
    pRVar1 = this->fBI;
    local_40 = pRVar1->fRuleStatusIndex;
    if (local_3c == -1) break;
    if (pRVar1->fDictionaryCharCount == 0) {
LAB_0029cbcd:
      pUVar3 = local_38;
      iVar6 = local_3c;
      if (local_3c < iVar11) {
        iVar12 = (this->fSideBuffer).count;
        if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
          UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,local_38);
          iVar12 = (this->fSideBuffer).count;
          if (UVar4 != '\0') goto LAB_0029cc00;
        }
        else {
LAB_0029cc00:
          (this->fSideBuffer).elements[iVar12] = iVar6;
          iVar12 = (this->fSideBuffer).count + 1;
          (this->fSideBuffer).count = iVar12;
        }
        iVar16 = local_40;
        if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
          UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,pUVar3);
          if (UVar4 == '\0') goto LAB_0029cc59;
          iVar12 = (this->fSideBuffer).count;
        }
        (this->fSideBuffer).elements[iVar12] = iVar16;
        piVar2 = &(this->fSideBuffer).count;
        *piVar2 = *piVar2 + 1;
      }
    }
    else {
      DictionaryCache::populateDictionary(pRVar1->fDictionaryCache,iVar6,local_3c,iVar16,local_40);
      UVar4 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar6,&local_3c,&local_40);
      pUVar3 = local_38;
      if (UVar4 == '\0') goto LAB_0029cbcd;
      do {
        iVar16 = local_3c;
        iVar6 = local_3c;
        if (iVar11 <= local_3c) break;
        iVar12 = (this->fSideBuffer).count;
        if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
          UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,pUVar3);
          iVar12 = (this->fSideBuffer).count;
          if (UVar4 != '\0') goto LAB_0029cb39;
        }
        else {
LAB_0029cb39:
          (this->fSideBuffer).elements[iVar12] = iVar16;
          iVar12 = (this->fSideBuffer).count + 1;
          (this->fSideBuffer).count = iVar12;
        }
        iVar6 = local_40;
        if ((iVar12 < -1) || ((this->fSideBuffer).capacity <= iVar12)) {
          UVar4 = UVector32::expandCapacity(this_00,iVar12 + 1,pUVar3);
          if (UVar4 != '\0') {
            iVar12 = (this->fSideBuffer).count;
            goto LAB_0029cb7e;
          }
        }
        else {
LAB_0029cb7e:
          (this->fSideBuffer).elements[iVar12] = iVar6;
          piVar2 = &(this->fSideBuffer).count;
          *piVar2 = *piVar2 + 1;
        }
        UVar4 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar16,&local_3c,&local_40);
        iVar6 = local_3c;
      } while (UVar4 != '\0');
    }
LAB_0029cc59:
  } while (iVar6 < iVar11);
  uVar10 = (this->fSideBuffer).count;
  uVar9 = (ulong)uVar10;
  uVar5 = 0;
  if (uVar10 == 0) {
    return '\0';
  }
  if (0 < (int)uVar10) {
    uVar7 = uVar10 - 1;
    (this->fSideBuffer).count = uVar7;
    uVar5 = (uint16_t)(this->fSideBuffer).elements[uVar7];
    if (uVar7 != 0) {
      uVar9 = (ulong)(uVar10 - 2);
      (this->fSideBuffer).count = uVar10 - 2;
      iVar11 = (this->fSideBuffer).elements[uVar9];
      goto LAB_0029cca6;
    }
    uVar9 = 0;
  }
  iVar11 = 0;
LAB_0029cca6:
  uVar10 = this->fStartBufIdx - 1U & 0x7f;
  if (uVar10 == this->fEndBufIdx) {
    this->fEndBufIdx = this->fStartBufIdx + 0x7eU & 0x7f;
  }
  this->fBoundaries[uVar10] = iVar11;
  this->fStatuses[uVar10] = uVar5;
  this->fStartBufIdx = uVar10;
  this->fBufIdx = uVar10;
  this->fTextIdx = iVar11;
  if ((int)uVar9 != 0) {
    uVar10 = this->fEndBufIdx;
    piVar2 = (this->fSideBuffer).elements;
    uVar7 = this->fBufIdx;
    uVar13 = this->fStartBufIdx;
    do {
      iVar12 = (int)uVar9;
      if (iVar12 < 1) {
        uVar5 = 0;
LAB_0029ccf6:
        iVar11 = 0;
      }
      else {
        uVar14 = iVar12 - 1;
        (this->fSideBuffer).count = uVar14;
        uVar5 = (uint16_t)piVar2[uVar14];
        if (uVar14 == 0) {
          uVar9 = 0;
          goto LAB_0029ccf6;
        }
        uVar9 = (ulong)(iVar12 - 2U);
        (this->fSideBuffer).count = iVar12 - 2U;
        iVar11 = piVar2[uVar9];
      }
      uVar14 = uVar13 - 1 & 0x7f;
      if (uVar14 == uVar10) {
        if (uVar7 == uVar10) {
          return '\x01';
        }
        uVar10 = uVar13 + 0x7e & 0x7f;
        this->fEndBufIdx = uVar10;
      }
      this->fBoundaries[uVar14] = iVar11;
      this->fStatuses[uVar14] = uVar5;
      this->fStartBufIdx = uVar14;
      uVar13 = uVar14;
    } while ((int)uVar9 != 0);
  }
  return '\x01';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }